

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/3rdparty/catch.hpp:9717:44)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_alecthomas[P]entityx_entityx_3rdparty_catch_hpp:9717:44)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConfigData *pCVar2;
  pointer pbVar3;
  value_type *pvVar4;
  char cVar5;
  istream *piVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  ulong *puVar9;
  _Alloc_hider _Var10;
  ParserResult *pPVar11;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  ifstream f;
  value_type local_2f0;
  ParserResult *local_2d0;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined **local_268;
  undefined8 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [16];
  long local_238 [65];
  
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2d0 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_assign((string *)&local_2a8);
  local_258 = local_248;
  local_260 = 0;
  local_268 = &PTR__BasicResult_001cd478;
  local_250 = 0;
  local_248[0] = 0;
  ::std::ifstream::ifstream((istream *)local_238,local_2a8._M_dataplus._M_p,_S_in);
  cVar5 = ::std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    local_2f0._M_string_length = 0;
    local_2f0.field_2._M_allocated_capacity =
         local_2f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar1 = &local_2c8.field_2;
LAB_0017b222:
    do {
      cVar5 = ::std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
      piVar6 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2f0,cVar5);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_0017b3c4;
      trim(&local_2c8,&local_2f0);
      ::std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if (local_2f0._M_string_length != 0) {
        if (*local_2f0._M_dataplus._M_p != '\"') {
          if (*local_2f0._M_dataplus._M_p == '#') goto LAB_0017b222;
          ::std::operator+(&local_288,'\"',&local_2f0);
          puVar7 = (undefined8 *)
                   ::std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_288,local_288._M_string_length,0,'\x01');
          psVar8 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_2c8.field_2._M_allocated_capacity = *psVar8;
            local_2c8.field_2._8_8_ = puVar7[3];
            local_2c8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_2c8.field_2._M_allocated_capacity = *psVar8;
            local_2c8._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_2c8._M_string_length = puVar7[1];
          *puVar7 = psVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&((this->m_lambda).config)->testsOrTags,&local_2f0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &((this->m_lambda).config)->testsOrTags,(char (*) [2])",");
      }
    } while( true );
  }
  ::std::operator+(&local_2c8,"Unable to load input file: \'",&local_2a8);
  puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_2c8);
  pPVar11 = local_2d0;
  puVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_2f0.field_2._M_allocated_capacity = *puVar9;
    local_2f0.field_2._8_4_ = *(undefined4 *)(puVar7 + 3);
    local_2f0.field_2._12_4_ = *(undefined4 *)((long)puVar7 + 0x1c);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *puVar9;
    local_2f0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_2f0._M_string_length = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  (local_2d0->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
       = RuntimeError;
  (local_2d0->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001cd478;
  (local_2d0->m_errorMessage)._M_dataplus._M_p = (pointer)&(local_2d0->m_errorMessage).field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0->m_errorMessage,local_2f0._M_dataplus._M_p,
             local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  pvVar4 = &local_2c8;
  _Var10._M_p = local_2c8._M_dataplus._M_p;
LAB_0017b480:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &pvVar4->field_2) {
    operator_delete(_Var10._M_p);
  }
  ::std::ifstream::~ifstream(local_238);
  local_268 = &PTR__BasicResult_001cd478;
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  return pPVar11;
LAB_0017b3c4:
  pCVar2 = (this->m_lambda).config;
  pbVar3 = (pCVar2->testsOrTags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pCVar2->testsOrTags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&pCVar2->testsOrTags,pbVar3 + -1);
  }
  *(undefined8 *)
   &(local_2d0->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
    m_type = 0;
  (local_2d0->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001cd478;
  (local_2d0->m_errorMessage)._M_dataplus._M_p = (pointer)&(local_2d0->m_errorMessage).field_2;
  (local_2d0->m_errorMessage)._M_string_length = 0;
  (local_2d0->m_errorMessage).field_2._M_local_buf[0] = '\0';
  pvVar4 = &local_2f0;
  _Var10._M_p = local_2f0._M_dataplus._M_p;
  pPVar11 = local_2d0;
  goto LAB_0017b480;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }